

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# addrman_tests.cpp
# Opt level: O3

void __thiscall addrman_tests::addrman_size::test_method(addrman_size *this)

{
  __single_object _Var1;
  readonly_property65 rVar2;
  bool bVar3;
  int32_t consistency_check_ratio;
  __uniq_ptr_data<AddrMan,_std::default_delete<AddrMan>,_true,_true> this_00;
  time_point tVar4;
  iterator in_R8;
  iterator pvVar5;
  iterator in_R9;
  iterator pvVar6;
  long in_FS_OFFSET;
  const_string file;
  const_string file_00;
  const_string file_01;
  const_string file_02;
  const_string file_03;
  initializer_list<CAddress> __l;
  const_string file_04;
  const_string file_05;
  initializer_list<CAddress> __l_00;
  const_string file_06;
  const_string file_07;
  const_string file_08;
  const_string file_09;
  const_string file_10;
  const_string file_11;
  const_string file_12;
  initializer_list<CAddress> __l_01;
  const_string file_13;
  const_string file_14;
  const_string file_15;
  const_string file_16;
  const_string file_17;
  const_string file_18;
  const_string msg;
  const_string msg_00;
  const_string msg_01;
  const_string msg_02;
  const_string msg_03;
  const_string msg_04;
  const_string msg_05;
  const_string msg_06;
  const_string msg_07;
  const_string msg_08;
  const_string msg_09;
  const_string msg_10;
  const_string msg_11;
  const_string msg_12;
  const_string msg_13;
  const_string msg_14;
  const_string msg_15;
  const_string msg_16;
  const_string msg_17;
  const_string msg_18;
  check_type cVar7;
  undefined1 *local_528;
  undefined1 *local_520;
  char *local_518;
  char *local_510;
  undefined1 *local_508;
  undefined1 *local_500;
  char *local_4f8;
  char *local_4f0;
  undefined1 *local_4e8;
  undefined1 *local_4e0;
  char *local_4d8;
  char *local_4d0;
  undefined1 *local_4c8;
  undefined1 *local_4c0;
  char *local_4b8;
  char *local_4b0;
  undefined1 *local_4a8;
  undefined1 *local_4a0;
  char *local_498;
  char *local_490;
  undefined4 local_484;
  size_t local_480;
  assertion_result local_478;
  char *local_460;
  undefined1 *local_458;
  undefined1 *local_450;
  char *local_448;
  char *local_440;
  char *local_438;
  char *local_430;
  undefined1 *local_428;
  undefined1 *local_420;
  char *local_418;
  char *local_410;
  undefined1 *local_408;
  undefined1 *local_400;
  char *local_3f8;
  char *local_3f0;
  undefined1 *local_3e8;
  undefined1 *local_3e0;
  char *local_3d8;
  char *local_3d0;
  undefined1 *local_3c8;
  undefined1 *local_3c0;
  char *local_3b8;
  char *local_3b0;
  undefined1 *local_3a8;
  undefined1 *local_3a0;
  char *local_398;
  char *local_390;
  undefined1 *local_388;
  undefined1 *local_380;
  char *local_378;
  char *local_370;
  undefined1 *local_368;
  undefined1 *local_360;
  char *local_358;
  char *local_350;
  char *local_348;
  char *local_340;
  undefined1 *local_338;
  undefined1 *local_330;
  char *local_328;
  char *local_320;
  char *local_318;
  char *local_310;
  undefined1 *local_308;
  undefined1 *local_300;
  char *local_2f8;
  char *local_2f0;
  char *local_2e8;
  char *local_2e0;
  undefined1 *local_2d8;
  undefined1 *local_2d0;
  char *local_2c8;
  char *local_2c0;
  undefined1 *local_2b8;
  undefined1 *local_2b0;
  char *local_2a8;
  char *local_2a0;
  undefined1 *local_298;
  undefined1 *local_290;
  char *local_288;
  char *local_280;
  undefined1 *local_278;
  undefined1 *local_270;
  char *local_268;
  char *local_260;
  undefined1 *local_258;
  undefined1 *local_250;
  char *local_248;
  char *local_240;
  __single_object addrman;
  undefined4 *local_230;
  assertion_result local_228;
  undefined4 **local_210;
  size_t *local_208;
  undefined8 local_200;
  char *local_1f8;
  undefined1 local_1f0 [16];
  shared_count sStack_1e0;
  undefined1 local_1d8 [16];
  shared_count sStack_1c8;
  undefined ***local_1c0;
  uint16_t local_1b8;
  NodeSeconds local_1b0;
  ServiceFlags SStack_1a8;
  direct_or_indirect local_1a0;
  uint local_190;
  char *local_188;
  uint16_t local_180;
  direct_or_indirect local_178;
  shared_count sStack_168;
  char *local_160;
  uint16_t local_158;
  direct_or_indirect local_150;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_140;
  uint16_t local_130;
  NodeSeconds local_128;
  ServiceFlags SStack_120;
  direct_or_indirect local_118;
  uint local_108;
  undefined8 local_100;
  uint16_t local_f8;
  direct_or_indirect local_f0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_e0;
  uint16_t local_d0;
  NodeSeconds local_c8;
  ServiceFlags SStack_c0;
  direct_or_indirect local_b8;
  uint local_a8;
  undefined8 local_a0;
  uint16_t local_98;
  direct_or_indirect local_90;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_80;
  uint16_t local_70;
  duration local_68;
  ServiceFlags SStack_60;
  direct_or_indirect local_58;
  uint local_48;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  consistency_check_ratio =
       GetCheckRatio((NodeContext *)(this->super_BOOST_AUTO_TEST_CASE_FIXTURE).m_node.args);
  this_00.super___uniq_ptr_impl<AddrMan,_std::default_delete<AddrMan>_>._M_t.
  super__Tuple_impl<0UL,_AddrMan_*,_std::default_delete<AddrMan>_>.
  super__Head_base<0UL,_AddrMan_*,_false>._M_head_impl =
       (__uniq_ptr_impl<AddrMan,_std::default_delete<AddrMan>_>)operator_new(8);
  AddrMan::AddrMan((AddrMan *)
                   this_00.super___uniq_ptr_impl<AddrMan,_std::default_delete<AddrMan>_>._M_t.
                   super__Tuple_impl<0UL,_AddrMan_*,_std::default_delete<AddrMan>_>.
                   super__Head_base<0UL,_AddrMan_*,_false>._M_head_impl,&EMPTY_NETGROUPMAN,true,
                   consistency_check_ratio);
  addrman._M_t.super___uniq_ptr_impl<AddrMan,_std::default_delete<AddrMan>_>._M_t.
  super__Tuple_impl<0UL,_AddrMan_*,_std::default_delete<AddrMan>_>.
  super__Head_base<0UL,_AddrMan_*,_false>._M_head_impl =
       (__uniq_ptr_data<AddrMan,_std::default_delete<AddrMan>,_true,_true>)
       (__uniq_ptr_data<AddrMan,_std::default_delete<AddrMan>,_true,_true>)
       this_00.super___uniq_ptr_impl<AddrMan,_std::default_delete<AddrMan>_>._M_t.
       super__Tuple_impl<0UL,_AddrMan_*,_std::default_delete<AddrMan>_>.
       super__Head_base<0UL,_AddrMan_*,_false>._M_head_impl;
  local_90.indirect_contents.indirect = (char *)&local_80;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,"252.2.2.2","");
  ResolveIP((CNetAddr *)&local_58.indirect_contents,(string *)&local_90);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90.indirect_contents.indirect != &local_80) {
    operator_delete(local_90.indirect_contents.indirect,(ulong)(local_80._M_allocated_capacity + 1))
    ;
  }
  local_248 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/addrman_tests.cpp"
  ;
  local_240 = "";
  local_258 = &boost::unit_test::basic_cstring<char_const>::null;
  local_250 = &boost::unit_test::basic_cstring<char_const>::null;
  file.m_end = (iterator)0x472;
  file.m_begin = (iterator)&local_248;
  msg.m_end = in_R9;
  msg.m_begin = in_R8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file,(size_t)&local_258,msg);
  local_150._8_8_ = local_150._8_8_ & 0xffffffffffffff00;
  local_150.indirect_contents.indirect = (char *)&PTR__lazy_ostream_01388f08;
  aStack_140._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  aStack_140._8_8_ = (long)"\x05\x04\x03\x02\x01" + 5;
  local_1f0._0_8_ =
       AddrMan::Size((AddrMan *)
                     addrman._M_t.super___uniq_ptr_impl<AddrMan,_std::default_delete<AddrMan>_>._M_t
                     .super__Tuple_impl<0UL,_AddrMan_*,_std::default_delete<AddrMan>_>.
                     super__Head_base<0UL,_AddrMan_*,_false>._M_head_impl,(optional<Network>)0x0,
                     (optional<bool>)0x0);
  local_228._0_8_ = local_1f0;
  local_478._0_8_ = &local_200;
  local_200._0_4_ = 0;
  local_1d8._8_8_ = (element_type *)0x0;
  sStack_1c8.pi_ = (sp_counted_base *)0x0;
  local_178.indirect_contents.indirect =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/addrman_tests.cpp"
  ;
  local_178._8_8_ =
       (long)
       "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/addrman_tests.cpp"
       + 0x66;
  local_80._8_8_ = &local_228;
  local_90.direct[8] = '\0';
  local_90.indirect_contents.indirect = (char *)&PTR__lazy_ostream_01388f48;
  local_80._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  local_f0.direct[8] = '\0';
  local_f0.indirect_contents.indirect = (char *)&PTR__lazy_ostream_01388f88;
  local_e0._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  pvVar5 = (iterator)0x1;
  pvVar6 = (iterator)0x2;
  local_e0._8_8_ = &local_478;
  local_1d8[0] = local_1f0._0_8_ == 0;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_1d8,(lazy_ostream *)&local_150,1,2,REQUIRE,0xe32561,
             (size_t)&local_178,0x472,&local_90,"0U",&local_f0);
  boost::detail::shared_count::~shared_count(&sStack_1c8);
  local_268 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/addrman_tests.cpp"
  ;
  local_260 = "";
  local_278 = &boost::unit_test::basic_cstring<char_const>::null;
  local_270 = &boost::unit_test::basic_cstring<char_const>::null;
  file_00.m_end = (iterator)0x473;
  file_00.m_begin = (iterator)&local_268;
  msg_00.m_end = pvVar6;
  msg_00.m_begin = pvVar5;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_00,(size_t)&local_278,
             msg_00);
  local_150._8_8_ = local_150._8_8_ & 0xffffffffffffff00;
  local_150.indirect_contents.indirect = (char *)&PTR__lazy_ostream_01388f08;
  aStack_140._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  aStack_140._8_8_ = (long)"\x05\x04\x03\x02\x01" + 5;
  local_1f0._0_8_ =
       AddrMan::Size((AddrMan *)
                     addrman._M_t.super___uniq_ptr_impl<AddrMan,_std::default_delete<AddrMan>_>._M_t
                     .super__Tuple_impl<0UL,_AddrMan_*,_std::default_delete<AddrMan>_>.
                     super__Head_base<0UL,_AddrMan_*,_false>._M_head_impl,
                     (optional<Network>)0x100000001,(optional<bool>)0x0);
  local_200._0_4_ = 0;
  local_1d8[0] = local_1f0._0_8_ == 0;
  local_1d8._8_8_ = (element_type *)0x0;
  sStack_1c8.pi_ = (sp_counted_base *)0x0;
  local_178.indirect_contents.indirect =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/addrman_tests.cpp"
  ;
  local_178._8_8_ =
       (long)
       "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/addrman_tests.cpp"
       + 0x66;
  local_228._0_8_ = local_1f0;
  local_90.direct[8] = '\0';
  local_90.indirect_contents.indirect = (char *)&PTR__lazy_ostream_01388f48;
  local_80._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  local_80._8_8_ = &local_228;
  local_478._0_8_ = &local_200;
  local_f0.direct[8] = '\0';
  local_f0.indirect_contents.indirect = (char *)&PTR__lazy_ostream_01388f88;
  local_e0._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  pvVar5 = (iterator)0x1;
  pvVar6 = (iterator)0x2;
  local_e0._8_8_ = &local_478;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_1d8,(lazy_ostream *)&local_150,1,2,REQUIRE,0xe3258c,
             (size_t)&local_178,0x473,&local_90,"0U",&local_f0);
  boost::detail::shared_count::~shared_count(&sStack_1c8);
  local_288 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/addrman_tests.cpp"
  ;
  local_280 = "";
  local_298 = &boost::unit_test::basic_cstring<char_const>::null;
  local_290 = &boost::unit_test::basic_cstring<char_const>::null;
  file_01.m_end = (iterator)0x474;
  file_01.m_begin = (iterator)&local_288;
  msg_01.m_end = pvVar6;
  msg_01.m_begin = pvVar5;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_01,(size_t)&local_298,
             msg_01);
  local_150._8_8_ = local_150._8_8_ & 0xffffffffffffff00;
  local_150.indirect_contents.indirect = (char *)&PTR__lazy_ostream_01388f08;
  aStack_140._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  aStack_140._8_8_ = (long)"\x05\x04\x03\x02\x01" + 5;
  local_1f0._0_8_ =
       AddrMan::Size((AddrMan *)
                     addrman._M_t.super___uniq_ptr_impl<AddrMan,_std::default_delete<AddrMan>_>._M_t
                     .super__Tuple_impl<0UL,_AddrMan_*,_std::default_delete<AddrMan>_>.
                     super__Head_base<0UL,_AddrMan_*,_false>._M_head_impl,(optional<Network>)0x0,
                     (optional<bool>)0x101);
  local_200._0_4_ = 0;
  local_1d8[0] = local_1f0._0_8_ == 0;
  local_1d8._8_8_ = (element_type *)0x0;
  sStack_1c8.pi_ = (sp_counted_base *)0x0;
  local_178.indirect_contents.indirect =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/addrman_tests.cpp"
  ;
  local_178._8_8_ =
       (long)
       "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/addrman_tests.cpp"
       + 0x66;
  local_228._0_8_ = local_1f0;
  local_90.direct[8] = '\0';
  local_90.indirect_contents.indirect = (char *)&PTR__lazy_ostream_01388f48;
  local_80._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  local_80._8_8_ = &local_228;
  local_478._0_8_ = &local_200;
  local_f0.direct[8] = '\0';
  local_f0.indirect_contents.indirect = (char *)&PTR__lazy_ostream_01388f88;
  local_e0._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  pvVar5 = (iterator)0x1;
  pvVar6 = (iterator)0x2;
  local_e0._8_8_ = &local_478;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_1d8,(lazy_ostream *)&local_150,1,2,REQUIRE,0xe325b3,
             (size_t)&local_178,0x474,&local_90,"0U",&local_f0);
  boost::detail::shared_count::~shared_count(&sStack_1c8);
  local_2a8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/addrman_tests.cpp"
  ;
  local_2a0 = "";
  local_2b8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_2b0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_02.m_end = (iterator)0x475;
  file_02.m_begin = (iterator)&local_2a8;
  msg_02.m_end = pvVar6;
  msg_02.m_begin = pvVar5;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_02,(size_t)&local_2b8,
             msg_02);
  local_150._8_8_ = local_150._8_8_ & 0xffffffffffffff00;
  local_150.indirect_contents.indirect = (char *)&PTR__lazy_ostream_01388f08;
  aStack_140._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  aStack_140._8_8_ = (long)"\x05\x04\x03\x02\x01" + 5;
  local_1f0._0_8_ =
       AddrMan::Size((AddrMan *)
                     addrman._M_t.super___uniq_ptr_impl<AddrMan,_std::default_delete<AddrMan>_>._M_t
                     .super__Tuple_impl<0UL,_AddrMan_*,_std::default_delete<AddrMan>_>.
                     super__Head_base<0UL,_AddrMan_*,_false>._M_head_impl,
                     (optional<Network>)0x100000001,(optional<bool>)0x100);
  local_200 = (char *)((ulong)local_200._4_4_ << 0x20);
  local_1d8[0] = local_1f0._0_8_ == 0;
  local_1d8._8_8_ = (element_type *)0x0;
  sStack_1c8.pi_ = (sp_counted_base *)0x0;
  local_178.indirect_contents.indirect =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/addrman_tests.cpp"
  ;
  local_178._8_8_ =
       (long)
       "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/addrman_tests.cpp"
       + 0x66;
  local_228._0_8_ = local_1f0;
  local_90.direct[8] = '\0';
  local_90.indirect_contents.indirect = (char *)&PTR__lazy_ostream_01388f48;
  local_80._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  local_80._8_8_ = &local_228;
  local_478._0_8_ = &local_200;
  local_f0.direct[8] = '\0';
  local_f0.indirect_contents.indirect = (char *)&PTR__lazy_ostream_01388f88;
  local_e0._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  pvVar5 = (iterator)0x1;
  pvVar6 = (iterator)0x2;
  local_e0._8_8_ = &local_478;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_1d8,(lazy_ostream *)&local_150,1,2,REQUIRE,0xe325d6,
             (size_t)&local_178,0x475,&local_90,"0U",&local_f0);
  boost::detail::shared_count::~shared_count(&sStack_1c8);
  local_f0.indirect_contents.indirect = (char *)&local_e0;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_f0,"250.1.1.1","");
  ResolveService((CService *)&local_b8.indirect_contents,(string *)&local_f0,0x208d);
  prevector<16U,_unsigned_char,_unsigned_int,_int>::prevector
            ((prevector<16U,_unsigned_char,_unsigned_int,_int> *)&local_90,
             (prevector<16U,_unsigned_char,_unsigned_int,_int> *)&local_b8.indirect_contents);
  local_80._8_8_ = local_a0;
  local_70 = local_98;
  local_68.__r = 100000000;
  SStack_60 = NODE_NONE;
  if (0x10 < local_a8) {
    free(local_b8.indirect_contents.indirect);
    local_b8.indirect_contents.indirect = (char *)0x0;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f0.indirect_contents.indirect != &local_e0) {
    operator_delete(local_f0.indirect_contents.indirect,(ulong)(local_e0._M_allocated_capacity + 1))
    ;
  }
  local_2c8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/addrman_tests.cpp"
  ;
  local_2c0 = "";
  local_2d8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_2d0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_03.m_end = (iterator)0x479;
  file_03.m_begin = (iterator)&local_2c8;
  msg_03.m_end = pvVar6;
  msg_03.m_begin = pvVar5;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_03,(size_t)&local_2d8,
             msg_03);
  _Var1 = addrman;
  prevector<16U,_unsigned_char,_unsigned_int,_int>::prevector
            ((prevector<16U,_unsigned_char,_unsigned_int,_int> *)&local_f0,
             (prevector<16U,_unsigned_char,_unsigned_int,_int> *)&local_90);
  local_e0._8_8_ = local_80._8_8_;
  local_d0 = local_70;
  local_c8.__d.__r = (duration)(duration)local_68.__r;
  SStack_c0 = SStack_60;
  __l._M_len = 1;
  __l._M_array = (iterator)&local_f0;
  std::vector<CAddress,_std::allocator<CAddress>_>::vector
            ((vector<CAddress,_std::allocator<CAddress>_> *)&local_178,__l,
             (allocator_type *)&local_478);
  _cVar7 = 0x24fe01;
  rVar2.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)
       AddrMan::Add((AddrMan *)
                    _Var1._M_t.super___uniq_ptr_impl<AddrMan,_std::default_delete<AddrMan>_>._M_t.
                    super__Tuple_impl<0UL,_AddrMan_*,_std::default_delete<AddrMan>_>.
                    super__Head_base<0UL,_AddrMan_*,_false>._M_head_impl,
                    (vector<CAddress,_std::allocator<CAddress>_> *)&local_178,
                    (CNetAddr *)&local_58.indirect_contents,(seconds)0x0);
  local_1d8[0] = rVar2.super_readonly_property<bool>.super_class_property<bool>.value;
  local_1d8._8_8_ = (element_type *)0x0;
  sStack_1c8.pi_ = (sp_counted_base *)0x0;
  local_228._0_8_ = "addrman->Add({addr1}, source)";
  local_228.m_message.px = (element_type *)0xe32613;
  local_150._8_8_ = local_150._8_8_ & 0xffffffffffffff00;
  local_150.indirect_contents.indirect = (char *)&PTR__lazy_ostream_01389048;
  aStack_140._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  aStack_140._8_8_ = &local_228;
  local_2e8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/addrman_tests.cpp"
  ;
  local_2e0 = "";
  pvVar5 = (iterator)0x1;
  pvVar6 = (iterator)0x0;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_1d8,(lazy_ostream *)&local_150,1,0,WARN,_cVar7,
             (size_t)&local_2e8,0x479);
  boost::detail::shared_count::~shared_count(&sStack_1c8);
  std::vector<CAddress,_std::allocator<CAddress>_>::~vector
            ((vector<CAddress,_std::allocator<CAddress>_> *)&local_178);
  if (0x10 < (uint)local_e0._M_allocated_capacity._0_4_) {
    free(local_f0.indirect_contents.indirect);
  }
  local_2f8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/addrman_tests.cpp"
  ;
  local_2f0 = "";
  local_308 = &boost::unit_test::basic_cstring<char_const>::null;
  local_300 = &boost::unit_test::basic_cstring<char_const>::null;
  file_04.m_end = (iterator)0x47a;
  file_04.m_begin = (iterator)&local_2f8;
  msg_04.m_end = pvVar6;
  msg_04.m_begin = pvVar5;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_04,(size_t)&local_308,
             msg_04);
  _Var1 = addrman;
  tVar4 = NodeClock::now();
  _cVar7 = 0x24ff1f;
  bVar3 = AddrMan::Good((AddrMan *)
                        _Var1._M_t.super___uniq_ptr_impl<AddrMan,_std::default_delete<AddrMan>_>.
                        _M_t.super__Tuple_impl<0UL,_AddrMan_*,_std::default_delete<AddrMan>_>.
                        super__Head_base<0UL,_AddrMan_*,_false>._M_head_impl,(CService *)&local_90,
                        (NodeSeconds)((long)tVar4.__d.__r / 1000000000));
  local_150.direct[0] = bVar3;
  local_150._8_8_ = (element_type *)0x0;
  aStack_140._M_allocated_capacity = 0;
  local_1d8._0_8_ = "addrman->Good(addr1)";
  local_1d8._8_8_ = (long)"addrman->Good(addr1)" + 0x14;
  local_f0.direct[8] = '\0';
  local_f0.indirect_contents.indirect = (char *)&PTR__lazy_ostream_01389048;
  local_e0._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  local_318 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/addrman_tests.cpp"
  ;
  local_310 = "";
  pvVar5 = (iterator)0x1;
  pvVar6 = (iterator)0x0;
  local_e0._8_8_ = (assertion_result *)local_1d8;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&local_150,(lazy_ostream *)&local_f0,1,0,WARN,_cVar7,
             (size_t)&local_318,0x47a);
  boost::detail::shared_count::~shared_count((shared_count *)&aStack_140);
  local_150.indirect_contents.indirect = (char *)(shared_count *)&aStack_140;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_150,"250.1.1.2","");
  ResolveService((CService *)&local_118.indirect_contents,(string *)&local_150,0x208d);
  prevector<16U,_unsigned_char,_unsigned_int,_int>::prevector
            ((prevector<16U,_unsigned_char,_unsigned_int,_int> *)&local_f0,
             (prevector<16U,_unsigned_char,_unsigned_int,_int> *)&local_118.indirect_contents);
  local_e0._8_8_ = local_100;
  local_d0 = local_f8;
  local_c8.__d.__r = (duration)100000000;
  SStack_c0 = NODE_NONE;
  if (0x10 < local_108) {
    free(local_118.indirect_contents.indirect);
    local_118.indirect_contents.indirect = (char *)0x0;
  }
  if ((shared_count *)local_150.indirect_contents.indirect != (shared_count *)&aStack_140) {
    operator_delete(local_150.indirect_contents.indirect,
                    (ulong)(aStack_140._M_allocated_capacity + 1));
  }
  local_328 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/addrman_tests.cpp"
  ;
  local_320 = "";
  local_338 = &boost::unit_test::basic_cstring<char_const>::null;
  local_330 = &boost::unit_test::basic_cstring<char_const>::null;
  file_05.m_end = (iterator)0x47c;
  file_05.m_begin = (iterator)&local_328;
  msg_05.m_end = pvVar6;
  msg_05.m_begin = pvVar5;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_05,(size_t)&local_338,
             msg_05);
  _Var1 = addrman;
  prevector<16U,_unsigned_char,_unsigned_int,_int>::prevector
            ((prevector<16U,_unsigned_char,_unsigned_int,_int> *)&local_150,
             (prevector<16U,_unsigned_char,_unsigned_int,_int> *)&local_f0);
  aStack_140._8_8_ = local_e0._8_8_;
  local_130 = local_d0;
  local_128.__d.__r = local_c8.__d.__r;
  SStack_120 = SStack_c0;
  __l_00._M_len = 1;
  __l_00._M_array = (iterator)&local_150;
  std::vector<CAddress,_std::allocator<CAddress>_>::vector
            ((vector<CAddress,_std::allocator<CAddress>_> *)&local_228,__l_00,
             (allocator_type *)local_1f0);
  _cVar7 = 0x250124;
  bVar3 = AddrMan::Add((AddrMan *)
                       _Var1._M_t.super___uniq_ptr_impl<AddrMan,_std::default_delete<AddrMan>_>._M_t
                       .super__Tuple_impl<0UL,_AddrMan_*,_std::default_delete<AddrMan>_>.
                       super__Head_base<0UL,_AddrMan_*,_false>._M_head_impl,
                       (vector<CAddress,_std::allocator<CAddress>_> *)&local_228,
                       (CNetAddr *)&local_58.indirect_contents,(seconds)0x0);
  local_178.direct[0] = bVar3;
  local_178._8_8_ = (element_type *)0x0;
  sStack_168.pi_ = (sp_counted_base *)0x0;
  local_478._0_8_ = "addrman->Add({addr2}, source)";
  local_478.m_message.px = (element_type *)0xe32646;
  local_1d8._8_8_ = local_1d8._8_8_ & 0xffffffffffffff00;
  local_1d8._0_8_ = &PTR__lazy_ostream_01389048;
  sStack_1c8.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_1c0 = (undefined ***)&local_478;
  local_348 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/addrman_tests.cpp"
  ;
  local_340 = "";
  pvVar5 = (iterator)0x1;
  pvVar6 = (iterator)0x0;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&local_178,(lazy_ostream *)local_1d8,1,0,WARN,_cVar7,
             (size_t)&local_348,0x47c);
  boost::detail::shared_count::~shared_count(&sStack_168);
  std::vector<CAddress,_std::allocator<CAddress>_>::~vector
            ((vector<CAddress,_std::allocator<CAddress>_> *)&local_228);
  if (0x10 < (uint)aStack_140._M_allocated_capacity._0_4_) {
    free(local_150.indirect_contents.indirect);
  }
  local_358 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/addrman_tests.cpp"
  ;
  local_350 = "";
  local_368 = &boost::unit_test::basic_cstring<char_const>::null;
  local_360 = &boost::unit_test::basic_cstring<char_const>::null;
  file_06.m_end = (iterator)0x47e;
  file_06.m_begin = (iterator)&local_358;
  msg_06.m_end = pvVar6;
  msg_06.m_begin = pvVar5;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_06,(size_t)&local_368,
             msg_06);
  local_178._8_8_ = local_178._8_8_ & 0xffffffffffffff00;
  local_178.indirect_contents.indirect = (char *)&PTR__lazy_ostream_01388f08;
  sStack_168.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_160 = "";
  local_208 = (size_t *)
              AddrMan::Size((AddrMan *)
                            addrman._M_t.
                            super___uniq_ptr_impl<AddrMan,_std::default_delete<AddrMan>_>._M_t.
                            super__Tuple_impl<0UL,_AddrMan_*,_std::default_delete<AddrMan>_>.
                            super__Head_base<0UL,_AddrMan_*,_false>._M_head_impl,
                            (optional<Network>)0x0,(optional<bool>)0x0);
  local_1f0._0_8_ = &local_208;
  local_200 = (char *)&local_230;
  local_230._0_4_ = 2;
  local_228.m_message.px = (element_type *)0x0;
  local_228.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_478._0_8_ =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/addrman_tests.cpp"
  ;
  local_478.m_message.px = (element_type *)0xe30adf;
  local_150._8_8_ = local_150._8_8_ & 0xffffffffffffff00;
  local_150.indirect_contents.indirect = (char *)&PTR__lazy_ostream_01388f48;
  aStack_140._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  aStack_140._8_8_ = local_1f0;
  local_1d8._8_8_ = local_1d8._8_8_ & 0xffffffffffffff00;
  local_1d8._0_8_ = &PTR__lazy_ostream_01388f88;
  sStack_1c8.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_1c0 = (undefined ***)&local_200;
  pvVar5 = (iterator)0x1;
  pvVar6 = (iterator)0x2;
  local_228.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(readonly_property<bool>)(local_208 == (size_t *)0x2);
  boost::test_tools::tt_detail::report_assertion
            (&local_228,(lazy_ostream *)&local_178,1,2,REQUIRE,0xe32561,(size_t)&local_478,0x47e,
             (iterator)&local_150,"2U",(lazy_ostream *)local_1d8);
  boost::detail::shared_count::~shared_count(&local_228.m_message.pn);
  local_378 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/addrman_tests.cpp"
  ;
  local_370 = "";
  local_388 = &boost::unit_test::basic_cstring<char_const>::null;
  local_380 = &boost::unit_test::basic_cstring<char_const>::null;
  file_07.m_end = (iterator)0x47f;
  file_07.m_begin = (iterator)&local_378;
  msg_07.m_end = pvVar6;
  msg_07.m_begin = pvVar5;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_07,(size_t)&local_388,
             msg_07);
  local_178._8_8_ = local_178._8_8_ & 0xffffffffffffff00;
  local_178.indirect_contents.indirect = (char *)&PTR__lazy_ostream_01388f08;
  sStack_168.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_160 = "";
  local_208 = (size_t *)
              AddrMan::Size((AddrMan *)
                            addrman._M_t.
                            super___uniq_ptr_impl<AddrMan,_std::default_delete<AddrMan>_>._M_t.
                            super__Tuple_impl<0UL,_AddrMan_*,_std::default_delete<AddrMan>_>.
                            super__Head_base<0UL,_AddrMan_*,_false>._M_head_impl,
                            (optional<Network>)0x100000001,(optional<bool>)0x0);
  local_230._0_4_ = 2;
  local_228.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(local_208 == (size_t *)0x2);
  local_228.m_message.px = (element_type *)0x0;
  local_228.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_478._0_8_ =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/addrman_tests.cpp"
  ;
  local_478.m_message.px = (element_type *)0xe30adf;
  local_1f0._0_8_ = &local_208;
  local_150._8_8_ = local_150._8_8_ & 0xffffffffffffff00;
  local_150.indirect_contents.indirect = (char *)&PTR__lazy_ostream_01388f48;
  aStack_140._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  aStack_140._8_8_ = local_1f0;
  local_200 = (char *)&local_230;
  local_1d8._8_8_ = local_1d8._8_8_ & 0xffffffffffffff00;
  local_1d8._0_8_ = &PTR__lazy_ostream_01388f88;
  sStack_1c8.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_1c0 = (undefined ***)&local_200;
  pvVar5 = (iterator)0x1;
  pvVar6 = (iterator)0x2;
  boost::test_tools::tt_detail::report_assertion
            (&local_228,(lazy_ostream *)&local_178,1,2,REQUIRE,0xe3258c,(size_t)&local_478,0x47f,
             (iterator)&local_150,"2U",(lazy_ostream *)local_1d8);
  boost::detail::shared_count::~shared_count(&local_228.m_message.pn);
  local_398 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/addrman_tests.cpp"
  ;
  local_390 = "";
  local_3a8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_3a0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_08.m_end = (iterator)0x480;
  file_08.m_begin = (iterator)&local_398;
  msg_08.m_end = pvVar6;
  msg_08.m_begin = pvVar5;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_08,(size_t)&local_3a8,
             msg_08);
  local_178._8_8_ = local_178._8_8_ & 0xffffffffffffff00;
  local_178.indirect_contents.indirect = (char *)&PTR__lazy_ostream_01388f08;
  sStack_168.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_160 = "";
  local_208 = (size_t *)
              AddrMan::Size((AddrMan *)
                            addrman._M_t.
                            super___uniq_ptr_impl<AddrMan,_std::default_delete<AddrMan>_>._M_t.
                            super__Tuple_impl<0UL,_AddrMan_*,_std::default_delete<AddrMan>_>.
                            super__Head_base<0UL,_AddrMan_*,_false>._M_head_impl,
                            (optional<Network>)0x0,(optional<bool>)0x101);
  local_230._0_4_ = 1;
  local_228.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(local_208 == (size_t *)0x1);
  local_228.m_message.px = (element_type *)0x0;
  local_228.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_478._0_8_ =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/addrman_tests.cpp"
  ;
  local_478.m_message.px = (element_type *)0xe30adf;
  local_1f0._0_8_ = &local_208;
  local_150._8_8_ = local_150._8_8_ & 0xffffffffffffff00;
  local_150.indirect_contents.indirect = (char *)&PTR__lazy_ostream_01388f48;
  aStack_140._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  aStack_140._8_8_ = local_1f0;
  local_200 = (char *)&local_230;
  local_1d8._8_8_ = local_1d8._8_8_ & 0xffffffffffffff00;
  local_1d8._0_8_ = &PTR__lazy_ostream_01388f88;
  sStack_1c8.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_1c0 = (undefined ***)&local_200;
  pvVar5 = (iterator)0x1;
  pvVar6 = (iterator)0x2;
  boost::test_tools::tt_detail::report_assertion
            (&local_228,(lazy_ostream *)&local_178,1,2,REQUIRE,0xe325b3,(size_t)&local_478,0x480,
             (iterator)&local_150,"1U",(lazy_ostream *)local_1d8);
  boost::detail::shared_count::~shared_count(&local_228.m_message.pn);
  local_3b8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/addrman_tests.cpp"
  ;
  local_3b0 = "";
  local_3c8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_3c0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_09.m_end = (iterator)0x481;
  file_09.m_begin = (iterator)&local_3b8;
  msg_09.m_end = pvVar6;
  msg_09.m_begin = pvVar5;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_09,(size_t)&local_3c8,
             msg_09);
  local_178._8_8_ = local_178._8_8_ & 0xffffffffffffff00;
  local_178.indirect_contents.indirect = (char *)&PTR__lazy_ostream_01388f08;
  sStack_168.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_160 = "";
  local_208 = (size_t *)
              AddrMan::Size((AddrMan *)
                            addrman._M_t.
                            super___uniq_ptr_impl<AddrMan,_std::default_delete<AddrMan>_>._M_t.
                            super__Tuple_impl<0UL,_AddrMan_*,_std::default_delete<AddrMan>_>.
                            super__Head_base<0UL,_AddrMan_*,_false>._M_head_impl,
                            (optional<Network>)0x0,(optional<bool>)0x100);
  local_230._0_4_ = 1;
  local_228.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(local_208 == (size_t *)0x1);
  local_228.m_message.px = (element_type *)0x0;
  local_228.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_478._0_8_ =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/addrman_tests.cpp"
  ;
  local_478.m_message.px = (element_type *)0xe30adf;
  local_1f0._0_8_ = &local_208;
  local_150._8_8_ = local_150._8_8_ & 0xffffffffffffff00;
  local_150.indirect_contents.indirect = (char *)&PTR__lazy_ostream_01388f48;
  aStack_140._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  aStack_140._8_8_ = local_1f0;
  local_200 = (char *)&local_230;
  local_1d8._8_8_ = local_1d8._8_8_ & 0xffffffffffffff00;
  local_1d8._0_8_ = &PTR__lazy_ostream_01388f88;
  sStack_1c8.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_1c0 = (undefined ***)&local_200;
  pvVar5 = (iterator)0x1;
  pvVar6 = (iterator)0x2;
  boost::test_tools::tt_detail::report_assertion
            (&local_228,(lazy_ostream *)&local_178,1,2,REQUIRE,0xe32647,(size_t)&local_478,0x481,
             (iterator)&local_150,"1U",(lazy_ostream *)local_1d8);
  boost::detail::shared_count::~shared_count(&local_228.m_message.pn);
  local_3d8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/addrman_tests.cpp"
  ;
  local_3d0 = "";
  local_3e8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_3e0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_10.m_end = (iterator)0x482;
  file_10.m_begin = (iterator)&local_3d8;
  msg_10.m_end = pvVar6;
  msg_10.m_begin = pvVar5;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_10,(size_t)&local_3e8,
             msg_10);
  local_178._8_8_ = local_178._8_8_ & 0xffffffffffffff00;
  local_178.indirect_contents.indirect = (char *)&PTR__lazy_ostream_01388f08;
  sStack_168.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_160 = "";
  local_208 = (size_t *)
              AddrMan::Size((AddrMan *)
                            addrman._M_t.
                            super___uniq_ptr_impl<AddrMan,_std::default_delete<AddrMan>_>._M_t.
                            super__Tuple_impl<0UL,_AddrMan_*,_std::default_delete<AddrMan>_>.
                            super__Head_base<0UL,_AddrMan_*,_false>._M_head_impl,
                            (optional<Network>)0x100000001,(optional<bool>)0x101);
  local_230._0_4_ = 1;
  local_228.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(local_208 == (size_t *)0x1);
  local_228.m_message.px = (element_type *)0x0;
  local_228.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_478._0_8_ =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/addrman_tests.cpp"
  ;
  local_478.m_message.px = (element_type *)0xe30adf;
  local_1f0._0_8_ = &local_208;
  local_150._8_8_ = local_150._8_8_ & 0xffffffffffffff00;
  local_150.indirect_contents.indirect = (char *)&PTR__lazy_ostream_01388f48;
  aStack_140._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  aStack_140._8_8_ = local_1f0;
  local_200 = (char *)&local_230;
  local_1d8._8_8_ = local_1d8._8_8_ & 0xffffffffffffff00;
  local_1d8._0_8_ = &PTR__lazy_ostream_01388f88;
  sStack_1c8.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_1c0 = (undefined ***)&local_200;
  pvVar5 = (iterator)0x1;
  pvVar6 = (iterator)0x2;
  boost::test_tools::tt_detail::report_assertion
            (&local_228,(lazy_ostream *)&local_178,1,2,REQUIRE,0xe3266b,(size_t)&local_478,0x482,
             (iterator)&local_150,"1U",(lazy_ostream *)local_1d8);
  boost::detail::shared_count::~shared_count(&local_228.m_message.pn);
  local_3f8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/addrman_tests.cpp"
  ;
  local_3f0 = "";
  local_408 = &boost::unit_test::basic_cstring<char_const>::null;
  local_400 = &boost::unit_test::basic_cstring<char_const>::null;
  file_11.m_end = (iterator)0x483;
  file_11.m_begin = (iterator)&local_3f8;
  msg_11.m_end = pvVar6;
  msg_11.m_begin = pvVar5;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_11,(size_t)&local_408,
             msg_11);
  local_178._8_8_ = local_178._8_8_ & 0xffffffffffffff00;
  local_178.indirect_contents.indirect = (char *)&PTR__lazy_ostream_01388f08;
  sStack_168.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_160 = "";
  local_208 = (size_t *)
              AddrMan::Size((AddrMan *)
                            addrman._M_t.
                            super___uniq_ptr_impl<AddrMan,_std::default_delete<AddrMan>_>._M_t.
                            super__Tuple_impl<0UL,_AddrMan_*,_std::default_delete<AddrMan>_>.
                            super__Head_base<0UL,_AddrMan_*,_false>._M_head_impl,
                            (optional<Network>)0x100000001,(optional<bool>)0x100);
  local_230 = (undefined4 *)CONCAT44(local_230._4_4_,1);
  local_228.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(readonly_property<bool>)(local_208 == (size_t *)0x1);
  local_228.m_message.px = (element_type *)0x0;
  local_228.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_478._0_8_ =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/addrman_tests.cpp"
  ;
  local_478.m_message.px = (element_type *)0xe30adf;
  local_1f0._0_8_ = &local_208;
  local_150._8_8_ = local_150._8_8_ & 0xffffffffffffff00;
  local_150.indirect_contents.indirect = (char *)&PTR__lazy_ostream_01388f48;
  aStack_140._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  aStack_140._8_8_ = local_1f0;
  local_200 = (char *)&local_230;
  local_1d8._8_8_ = local_1d8._8_8_ & 0xffffffffffffff00;
  local_1d8._0_8_ = &PTR__lazy_ostream_01388f88;
  sStack_1c8.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_1c0 = (undefined ***)&local_200;
  pvVar5 = (iterator)0x1;
  pvVar6 = (iterator)0x2;
  boost::test_tools::tt_detail::report_assertion
            (&local_228,(lazy_ostream *)&local_178,1,2,REQUIRE,0xe325d6,(size_t)&local_478,0x483,
             (iterator)&local_150,"1U",(lazy_ostream *)local_1d8);
  boost::detail::shared_count::~shared_count(&local_228.m_message.pn);
  CService::CService((CService *)&local_178);
  local_150.indirect_contents.indirect = (char *)&aStack_140;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_150,"UDHDrtrcetjm5sxzskjyr5ztpeszydbh4dpl3pl4utgqqw2v4jna.b32.I2P","")
  ;
  CNetAddr::SetSpecial((CNetAddr *)&local_178,(string *)&local_150);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_150.indirect_contents.indirect != &aStack_140) {
    operator_delete(local_150.indirect_contents.indirect,
                    (ulong)(aStack_140._M_allocated_capacity + 1));
  }
  prevector<16U,_unsigned_char,_unsigned_int,_int>::prevector
            ((prevector<16U,_unsigned_char,_unsigned_int,_int> *)&local_1a0.indirect_contents,
             (prevector<16U,_unsigned_char,_unsigned_int,_int> *)&local_178);
  local_188 = local_160;
  local_180 = local_158;
  prevector<16U,_unsigned_char,_unsigned_int,_int>::prevector
            ((prevector<16U,_unsigned_char,_unsigned_int,_int> *)&local_150,
             (prevector<16U,_unsigned_char,_unsigned_int,_int> *)&local_1a0.indirect_contents);
  aStack_140._8_8_ = local_188;
  local_130 = local_180;
  local_128.__d.__r = (duration)100000000;
  SStack_120 = NODE_NONE;
  if (0x10 < local_190) {
    free(local_1a0.indirect_contents.indirect);
    local_1a0.indirect_contents.indirect = (char *)0x0;
  }
  local_418 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/addrman_tests.cpp"
  ;
  local_410 = "";
  local_428 = &boost::unit_test::basic_cstring<char_const>::null;
  local_420 = &boost::unit_test::basic_cstring<char_const>::null;
  file_12.m_end = (iterator)0x489;
  file_12.m_begin = (iterator)&local_418;
  msg_12.m_end = pvVar6;
  msg_12.m_begin = pvVar5;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_12,(size_t)&local_428,
             msg_12);
  _Var1 = addrman;
  prevector<16U,_unsigned_char,_unsigned_int,_int>::prevector
            ((prevector<16U,_unsigned_char,_unsigned_int,_int> *)local_1d8,
             (prevector<16U,_unsigned_char,_unsigned_int,_int> *)&local_150);
  local_1c0 = (undefined ***)aStack_140._8_8_;
  local_1b8 = local_130;
  local_1b0.__d.__r = local_128.__d.__r;
  SStack_1a8 = SStack_120;
  __l_01._M_len = 1;
  __l_01._M_array = (iterator)local_1d8;
  std::vector<CAddress,_std::allocator<CAddress>_>::vector
            ((vector<CAddress,_std::allocator<CAddress>_> *)local_1f0,__l_01,
             (allocator_type *)&local_208);
  _cVar7 = 0x250cd9;
  bVar3 = AddrMan::Add((AddrMan *)
                       _Var1._M_t.super___uniq_ptr_impl<AddrMan,_std::default_delete<AddrMan>_>._M_t
                       .super__Tuple_impl<0UL,_AddrMan_*,_std::default_delete<AddrMan>_>.
                       super__Head_base<0UL,_AddrMan_*,_false>._M_head_impl,
                       (vector<CAddress,_std::allocator<CAddress>_> *)local_1f0,
                       (CNetAddr *)&local_58.indirect_contents,(seconds)0x0);
  local_478.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(readonly_property<bool>)bVar3;
  local_478.m_message.px = (element_type *)0x0;
  local_478.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_200 = "addrman->Add({addr3}, source)";
  local_1f8 = "";
  local_228.m_message.px = (element_type *)((ulong)local_228.m_message.px & 0xffffffffffffff00);
  local_228._0_8_ = &PTR__lazy_ostream_01389048;
  local_228.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_210 = (undefined4 **)&local_200;
  local_438 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/addrman_tests.cpp"
  ;
  local_430 = "";
  pvVar5 = (iterator)0x1;
  pvVar6 = (iterator)0x0;
  boost::test_tools::tt_detail::report_assertion
            (&local_478,(lazy_ostream *)&local_228,1,0,WARN,_cVar7,(size_t)&local_438,0x489);
  boost::detail::shared_count::~shared_count(&local_478.m_message.pn);
  std::vector<CAddress,_std::allocator<CAddress>_>::~vector
            ((vector<CAddress,_std::allocator<CAddress>_> *)local_1f0);
  if (0x10 < (uint)sStack_1c8.pi_) {
    free((void *)local_1d8._0_8_);
  }
  local_448 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/addrman_tests.cpp"
  ;
  local_440 = "";
  local_458 = &boost::unit_test::basic_cstring<char_const>::null;
  local_450 = &boost::unit_test::basic_cstring<char_const>::null;
  file_13.m_end = (iterator)0x48a;
  file_13.m_begin = (iterator)&local_448;
  msg_13.m_end = pvVar6;
  msg_13.m_begin = pvVar5;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_13,(size_t)&local_458,
             msg_13);
  local_478.m_message.px = (element_type *)((ulong)local_478.m_message.px & 0xffffffffffffff00);
  local_478._0_8_ = &PTR__lazy_ostream_01388f08;
  local_478.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_460 = "";
  local_480 = AddrMan::Size((AddrMan *)
                            addrman._M_t.
                            super___uniq_ptr_impl<AddrMan,_std::default_delete<AddrMan>_>._M_t.
                            super__Tuple_impl<0UL,_AddrMan_*,_std::default_delete<AddrMan>_>.
                            super__Head_base<0UL,_AddrMan_*,_false>._M_head_impl,
                            (optional<Network>)0x0,(optional<bool>)0x0);
  local_208 = &local_480;
  local_230 = &local_484;
  local_484 = 3;
  local_1f0._8_8_ = (element_type *)0x0;
  sStack_1e0.pi_ = (sp_counted_base *)0x0;
  local_200 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/addrman_tests.cpp"
  ;
  local_1f8 = "";
  local_1d8._8_8_ = local_1d8._8_8_ & 0xffffffffffffff00;
  local_1d8._0_8_ = &PTR__lazy_ostream_01388f48;
  sStack_1c8.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_1c0 = (undefined ***)&local_208;
  local_228.m_message.px = (element_type *)((ulong)local_228.m_message.px & 0xffffffffffffff00);
  local_228._0_8_ = &PTR__lazy_ostream_01388f88;
  local_228.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_210 = &local_230;
  pvVar5 = (iterator)0x1;
  pvVar6 = (iterator)0x2;
  local_1f0[0] = (class_property<bool>)(class_property<bool>)(local_480 == 3);
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_1f0,(lazy_ostream *)&local_478,1,2,REQUIRE,0xe32561,
             (size_t)&local_200,0x48a,(iterator)local_1d8,"3U",(lazy_ostream *)&local_228);
  boost::detail::shared_count::~shared_count
            ((shared_count *)((long)&((assertion_result *)local_1f0)->m_message + 8));
  local_498 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/addrman_tests.cpp"
  ;
  local_490 = "";
  local_4a8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_4a0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_14.m_end = (iterator)0x48b;
  file_14.m_begin = (iterator)&local_498;
  msg_14.m_end = pvVar6;
  msg_14.m_begin = pvVar5;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_14,(size_t)&local_4a8,
             msg_14);
  local_478.m_message.px = (element_type *)((ulong)local_478.m_message.px & 0xffffffffffffff00);
  local_478._0_8_ = &PTR__lazy_ostream_01388f08;
  local_478.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_460 = "";
  local_480 = AddrMan::Size((AddrMan *)
                            addrman._M_t.
                            super___uniq_ptr_impl<AddrMan,_std::default_delete<AddrMan>_>._M_t.
                            super__Tuple_impl<0UL,_AddrMan_*,_std::default_delete<AddrMan>_>.
                            super__Head_base<0UL,_AddrMan_*,_false>._M_head_impl,
                            (optional<Network>)0x100000001,(optional<bool>)0x0);
  local_484 = 2;
  local_1f0[0] = (class_property<bool>)(local_480 == 2);
  local_1f0._8_8_ = (element_type *)0x0;
  sStack_1e0.pi_ = (sp_counted_base *)0x0;
  local_200 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/addrman_tests.cpp"
  ;
  local_1f8 = "";
  local_208 = &local_480;
  local_1d8._8_8_ = local_1d8._8_8_ & 0xffffffffffffff00;
  local_1d8._0_8_ = &PTR__lazy_ostream_01388f48;
  sStack_1c8.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_1c0 = (undefined ***)&local_208;
  local_230 = &local_484;
  local_228.m_message.px = (element_type *)((ulong)local_228.m_message.px & 0xffffffffffffff00);
  local_228._0_8_ = &PTR__lazy_ostream_01388f88;
  local_228.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_210 = &local_230;
  pvVar5 = (iterator)0x1;
  pvVar6 = (iterator)0x2;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_1f0,(lazy_ostream *)&local_478,1,2,REQUIRE,0xe3258c,
             (size_t)&local_200,0x48b,(iterator)local_1d8,"2U",(lazy_ostream *)&local_228);
  boost::detail::shared_count::~shared_count
            ((shared_count *)((long)&((assertion_result *)local_1f0)->m_message + 8));
  local_4b8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/addrman_tests.cpp"
  ;
  local_4b0 = "";
  local_4c8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_4c0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_15.m_end = (iterator)0x48c;
  file_15.m_begin = (iterator)&local_4b8;
  msg_15.m_end = pvVar6;
  msg_15.m_begin = pvVar5;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_15,(size_t)&local_4c8,
             msg_15);
  local_478.m_message.px = (element_type *)((ulong)local_478.m_message.px & 0xffffffffffffff00);
  local_478._0_8_ = &PTR__lazy_ostream_01388f08;
  local_478.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_460 = "";
  local_480 = AddrMan::Size((AddrMan *)
                            addrman._M_t.
                            super___uniq_ptr_impl<AddrMan,_std::default_delete<AddrMan>_>._M_t.
                            super__Tuple_impl<0UL,_AddrMan_*,_std::default_delete<AddrMan>_>.
                            super__Head_base<0UL,_AddrMan_*,_false>._M_head_impl,
                            (optional<Network>)0x100000004,(optional<bool>)0x0);
  local_484 = 1;
  local_1f0[0] = (class_property<bool>)(local_480 == 1);
  local_1f0._8_8_ = (element_type *)0x0;
  sStack_1e0.pi_ = (sp_counted_base *)0x0;
  local_200 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/addrman_tests.cpp"
  ;
  local_1f8 = "";
  local_208 = &local_480;
  local_1d8._8_8_ = local_1d8._8_8_ & 0xffffffffffffff00;
  local_1d8._0_8_ = &PTR__lazy_ostream_01388f48;
  sStack_1c8.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_1c0 = (undefined ***)&local_208;
  local_230 = &local_484;
  local_228.m_message.px = (element_type *)((ulong)local_228.m_message.px & 0xffffffffffffff00);
  local_228._0_8_ = &PTR__lazy_ostream_01388f88;
  local_228.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_210 = &local_230;
  pvVar5 = (iterator)0x1;
  pvVar6 = (iterator)0x2;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_1f0,(lazy_ostream *)&local_478,1,2,REQUIRE,0xe326e5,
             (size_t)&local_200,0x48c,(iterator)local_1d8,"1U",(lazy_ostream *)&local_228);
  boost::detail::shared_count::~shared_count
            ((shared_count *)((long)&((assertion_result *)local_1f0)->m_message + 8));
  local_4d8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/addrman_tests.cpp"
  ;
  local_4d0 = "";
  local_4e8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_4e0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_16.m_end = (iterator)0x48d;
  file_16.m_begin = (iterator)&local_4d8;
  msg_16.m_end = pvVar6;
  msg_16.m_begin = pvVar5;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_16,(size_t)&local_4e8,
             msg_16);
  local_478.m_message.px = (element_type *)((ulong)local_478.m_message.px & 0xffffffffffffff00);
  local_478._0_8_ = &PTR__lazy_ostream_01388f08;
  local_478.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_460 = "";
  local_480 = AddrMan::Size((AddrMan *)
                            addrman._M_t.
                            super___uniq_ptr_impl<AddrMan,_std::default_delete<AddrMan>_>._M_t.
                            super__Tuple_impl<0UL,_AddrMan_*,_std::default_delete<AddrMan>_>.
                            super__Head_base<0UL,_AddrMan_*,_false>._M_head_impl,
                            (optional<Network>)0x100000004,(optional<bool>)0x101);
  local_484 = 1;
  local_1f0[0] = (class_property<bool>)(local_480 == 1);
  local_1f0._8_8_ = (element_type *)0x0;
  sStack_1e0.pi_ = (sp_counted_base *)0x0;
  local_200 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/addrman_tests.cpp"
  ;
  local_1f8 = "";
  local_208 = &local_480;
  local_1d8._8_8_ = local_1d8._8_8_ & 0xffffffffffffff00;
  local_1d8._0_8_ = &PTR__lazy_ostream_01388f48;
  sStack_1c8.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_1c0 = (undefined ***)&local_208;
  local_230 = &local_484;
  local_228.m_message.px = (element_type *)((ulong)local_228.m_message.px & 0xffffffffffffff00);
  local_228._0_8_ = &PTR__lazy_ostream_01388f88;
  local_228.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_210 = &local_230;
  pvVar5 = (iterator)0x1;
  pvVar6 = (iterator)0x2;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_1f0,(lazy_ostream *)&local_478,1,2,REQUIRE,0xe3270b,
             (size_t)&local_200,0x48d,(iterator)local_1d8,"1U",(lazy_ostream *)&local_228);
  boost::detail::shared_count::~shared_count
            ((shared_count *)((long)&((assertion_result *)local_1f0)->m_message + 8));
  local_4f8 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/addrman_tests.cpp"
  ;
  local_4f0 = "";
  local_508 = &boost::unit_test::basic_cstring<char_const>::null;
  local_500 = &boost::unit_test::basic_cstring<char_const>::null;
  file_17.m_end = (iterator)0x48e;
  file_17.m_begin = (iterator)&local_4f8;
  msg_17.m_end = pvVar6;
  msg_17.m_begin = pvVar5;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_17,(size_t)&local_508,
             msg_17);
  local_478.m_message.px = (element_type *)((ulong)local_478.m_message.px & 0xffffffffffffff00);
  local_478._0_8_ = &PTR__lazy_ostream_01388f08;
  local_478.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_460 = "";
  local_480 = AddrMan::Size((AddrMan *)
                            addrman._M_t.
                            super___uniq_ptr_impl<AddrMan,_std::default_delete<AddrMan>_>._M_t.
                            super__Tuple_impl<0UL,_AddrMan_*,_std::default_delete<AddrMan>_>.
                            super__Head_base<0UL,_AddrMan_*,_false>._M_head_impl,
                            (optional<Network>)0x0,(optional<bool>)0x101);
  local_484 = 2;
  local_1f0[0] = (class_property<bool>)(local_480 == 2);
  local_1f0._8_8_ = (element_type *)0x0;
  sStack_1e0.pi_ = (sp_counted_base *)0x0;
  local_200 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/addrman_tests.cpp"
  ;
  local_1f8 = "";
  local_208 = &local_480;
  local_1d8._8_8_ = local_1d8._8_8_ & 0xffffffffffffff00;
  local_1d8._0_8_ = &PTR__lazy_ostream_01388f48;
  sStack_1c8.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_1c0 = (undefined ***)&local_208;
  local_230 = &local_484;
  local_228.m_message.px = (element_type *)((ulong)local_228.m_message.px & 0xffffffffffffff00);
  local_228._0_8_ = &PTR__lazy_ostream_01388f88;
  local_228.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_210 = &local_230;
  pvVar5 = (iterator)0x1;
  pvVar6 = (iterator)0x2;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_1f0,(lazy_ostream *)&local_478,1,2,REQUIRE,0xe325b3,
             (size_t)&local_200,0x48e,(iterator)local_1d8,"2U",(lazy_ostream *)&local_228);
  boost::detail::shared_count::~shared_count
            ((shared_count *)((long)&((assertion_result *)local_1f0)->m_message + 8));
  local_518 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/addrman_tests.cpp"
  ;
  local_510 = "";
  local_528 = &boost::unit_test::basic_cstring<char_const>::null;
  local_520 = &boost::unit_test::basic_cstring<char_const>::null;
  file_18.m_end = (iterator)0x48f;
  file_18.m_begin = (iterator)&local_518;
  msg_18.m_end = pvVar6;
  msg_18.m_begin = pvVar5;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_18,(size_t)&local_528,
             msg_18);
  local_478.m_message.px = (element_type *)((ulong)local_478.m_message.px & 0xffffffffffffff00);
  local_478._0_8_ = &PTR__lazy_ostream_01388f08;
  local_478.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_460 = "";
  local_480 = AddrMan::Size((AddrMan *)
                            addrman._M_t.
                            super___uniq_ptr_impl<AddrMan,_std::default_delete<AddrMan>_>._M_t.
                            super__Tuple_impl<0UL,_AddrMan_*,_std::default_delete<AddrMan>_>.
                            super__Head_base<0UL,_AddrMan_*,_false>._M_head_impl,
                            (optional<Network>)0x0,(optional<bool>)0x100);
  local_484 = 1;
  local_1f0[0] = (class_property<bool>)(class_property<bool>)(local_480 == 1);
  local_1f0._8_8_ = (element_type *)0x0;
  sStack_1e0.pi_ = (sp_counted_base *)0x0;
  local_200 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/addrman_tests.cpp"
  ;
  local_1f8 = "";
  local_208 = &local_480;
  local_1d8._8_8_ = local_1d8._8_8_ & 0xffffffffffffff00;
  local_1d8._0_8_ = &PTR__lazy_ostream_01388f48;
  sStack_1c8.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_1c0 = (undefined ***)&local_208;
  local_230 = &local_484;
  local_228.m_message.px = (element_type *)((ulong)local_228.m_message.px & 0xffffffffffffff00);
  local_228._0_8_ = &PTR__lazy_ostream_01388f88;
  local_228.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_210 = &local_230;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_1f0,(lazy_ostream *)&local_478,1,2,REQUIRE,0xe32647,
             (size_t)&local_200,0x48f,(iterator)local_1d8,"1U",(lazy_ostream *)&local_228);
  boost::detail::shared_count::~shared_count
            ((shared_count *)((long)&((assertion_result *)local_1f0)->m_message + 8));
  if (0x10 < (uint)aStack_140._M_allocated_capacity._0_4_) {
    free(local_150.indirect_contents.indirect);
  }
  if (0x10 < (uint)sStack_168.pi_) {
    free(local_178.indirect_contents.indirect);
  }
  if (0x10 < (uint)local_e0._M_allocated_capacity._0_4_) {
    free(local_f0.indirect_contents.indirect);
  }
  if (0x10 < (uint)local_80._M_allocated_capacity._0_4_) {
    free(local_90.indirect_contents.indirect);
  }
  if (0x10 < local_48) {
    free(local_58.indirect_contents.indirect);
  }
  std::unique_ptr<AddrMan,_std::default_delete<AddrMan>_>::~unique_ptr(&addrman);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

BOOST_AUTO_TEST_CASE(addrman_size)
{
    auto addrman = std::make_unique<AddrMan>(EMPTY_NETGROUPMAN, DETERMINISTIC, GetCheckRatio(m_node));
    const CNetAddr source = ResolveIP("252.2.2.2");

    // empty addrman
    BOOST_CHECK_EQUAL(addrman->Size(/*net=*/std::nullopt, /*in_new=*/std::nullopt), 0U);
    BOOST_CHECK_EQUAL(addrman->Size(/*net=*/NET_IPV4, /*in_new=*/std::nullopt), 0U);
    BOOST_CHECK_EQUAL(addrman->Size(/*net=*/std::nullopt, /*in_new=*/true), 0U);
    BOOST_CHECK_EQUAL(addrman->Size(/*net=*/NET_IPV4, /*in_new=*/false), 0U);

    // add two ipv4 addresses, one to tried and new
    const CAddress addr1{ResolveService("250.1.1.1", 8333), NODE_NONE};
    BOOST_CHECK(addrman->Add({addr1}, source));
    BOOST_CHECK(addrman->Good(addr1));
    const CAddress addr2{ResolveService("250.1.1.2", 8333), NODE_NONE};
    BOOST_CHECK(addrman->Add({addr2}, source));

    BOOST_CHECK_EQUAL(addrman->Size(/*net=*/std::nullopt, /*in_new=*/std::nullopt), 2U);
    BOOST_CHECK_EQUAL(addrman->Size(/*net=*/NET_IPV4, /*in_new=*/std::nullopt), 2U);
    BOOST_CHECK_EQUAL(addrman->Size(/*net=*/std::nullopt, /*in_new=*/true), 1U);
    BOOST_CHECK_EQUAL(addrman->Size(/*net=*/std::nullopt, /*in_new=*/false), 1U);
    BOOST_CHECK_EQUAL(addrman->Size(/*net=*/NET_IPV4, /*in_new=*/true), 1U);
    BOOST_CHECK_EQUAL(addrman->Size(/*net=*/NET_IPV4, /*in_new=*/false), 1U);

    // add one i2p address to new
    CService i2p_addr;
    i2p_addr.SetSpecial("UDHDrtrcetjm5sxzskjyr5ztpeszydbh4dpl3pl4utgqqw2v4jna.b32.I2P");
    const CAddress addr3{i2p_addr, NODE_NONE};
    BOOST_CHECK(addrman->Add({addr3}, source));
    BOOST_CHECK_EQUAL(addrman->Size(/*net=*/std::nullopt, /*in_new=*/std::nullopt), 3U);
    BOOST_CHECK_EQUAL(addrman->Size(/*net=*/NET_IPV4, /*in_new=*/std::nullopt), 2U);
    BOOST_CHECK_EQUAL(addrman->Size(/*net=*/NET_I2P, /*in_new=*/std::nullopt), 1U);
    BOOST_CHECK_EQUAL(addrman->Size(/*net=*/NET_I2P, /*in_new=*/true), 1U);
    BOOST_CHECK_EQUAL(addrman->Size(/*net=*/std::nullopt, /*in_new=*/true), 2U);
    BOOST_CHECK_EQUAL(addrman->Size(/*net=*/std::nullopt, /*in_new=*/false), 1U);
}